

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  ushort uVar1;
  int iCur;
  Table *pTab;
  Schema *pSVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vdbe *p;
  KeyInfo *zP4;
  Parse *pPVar8;
  Op *pOVar9;
  Schema **ppSVar10;
  int iVar11;
  int iVar12;
  int local_68;
  int local_64;
  int iPartIdxLabel;
  
  pTab = pIndex->pTable;
  iCur = pParse->nTab;
  pParse->nTab = iCur + 2;
  if (pIndex->pSchema == (Schema *)0x0) {
    iVar12 = -1000000;
  }
  else {
    iVar12 = -1;
    ppSVar10 = &pParse->db->aDb->pSchema;
    do {
      iVar12 = iVar12 + 1;
      pSVar2 = *ppSVar10;
      ppSVar10 = ppSVar10 + 4;
    } while (pSVar2 != pIndex->pSchema);
  }
  iVar4 = sqlite3AuthCheck(pParse,0x1b,pIndex->zName,(char *)0x0,pParse->db->aDb[iVar12].zDbSName);
  if (iVar4 == 0) {
    sqlite3TableLock(pParse,iVar12,pTab->tnum,'\x01',pTab->zName);
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      local_64 = memRootPage;
      if (memRootPage < 0) {
        local_64 = pIndex->tnum;
      }
      zP4 = sqlite3KeyInfoOfIndex(pParse,pIndex);
      iVar4 = pParse->nTab;
      pParse->nTab = iVar4 + 1;
      uVar1 = pIndex->nKeyCol;
      if (zP4 != (KeyInfo *)0x0) {
        zP4->nRef = zP4->nRef + 1;
      }
      iVar5 = sqlite3VdbeAddOp3(p,0x72,iVar4,0,(uint)uVar1);
      sqlite3VdbeChangeP4(p,iVar5,(char *)zP4,-9);
      sqlite3OpenTable(pParse,iCur,iVar12,pTab,0x6c);
      iVar5 = sqlite3VdbeAddOp3(p,0x24,iCur,0,0);
      if (pParse->nTempReg == '\0') {
        iVar11 = pParse->nMem + 1;
        pParse->nMem = iVar11;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar11 = pParse->aTempReg[bVar3];
      }
      pPVar8 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar8 = pParse;
      }
      pPVar8->isMultiWrite = '\x01';
      sqlite3GenerateIndexKey(pParse,pIndex,iCur,iVar11,0,&iPartIdxLabel,(Index *)0x0,0);
      sqlite3VdbeAddOp3(p,0x83,iVar4,iVar11,0);
      if (iPartIdxLabel != 0) {
        sqlite3VdbeResolveLabel(pParse->pVdbe,iPartIdxLabel);
      }
      sqlite3VdbeAddOp3(p,5,iCur,iVar5 + 1,0);
      if (p->db->mallocFailed == '\0') {
        iVar6 = p->nOp + -1;
        if (-1 < iVar5) {
          iVar6 = iVar5;
        }
        pOVar9 = p->aOp + iVar6;
      }
      else {
        pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      iVar5 = iCur + 1;
      pOVar9->p2 = p->nOp;
      if (memRootPage < 0) {
        sqlite3VdbeAddOp3(p,0x89,local_64,iVar12,0);
      }
      iVar12 = sqlite3VdbeAddOp3(p,0x6d,iVar5,local_64,iVar12);
      sqlite3VdbeChangeP4(p,iVar12,(char *)zP4,-9);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)(-1 < memRootPage) * 0x10 + 1;
      }
      iVar12 = sqlite3VdbeAddOp3(p,0x22,iVar4,0,0);
      if (pIndex->onError == '\0') {
        pPVar8 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar8 = pParse;
        }
        pPVar8->mayAbort = '\x01';
        local_68 = p->nOp;
      }
      else {
        iVar6 = sqlite3VdbeAddOp3(p,0xb,0,1,0);
        local_68 = p->nOp;
        uVar1 = pIndex->nKeyCol;
        iVar7 = sqlite3VdbeAddOp3(p,0x7d,iVar4,iVar6,iVar11);
        if (p->db->mallocFailed == '\0') {
          pOVar9 = p->aOp;
          pOVar9[iVar7].p4type = -3;
          *(uint *)&pOVar9[iVar7].p4 = (uint)uVar1;
        }
        sqlite3UniqueConstraint(pParse,2,pIndex);
        if (p->db->mallocFailed == '\0') {
          iVar7 = p->nOp + -1;
          if (-1 < iVar6) {
            iVar7 = iVar6;
          }
          pOVar9 = p->aOp + iVar7;
        }
        else {
          pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar9->p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x7e,iVar4,iVar11,iVar5);
      if ((pIndex->field_0x64 & 2) == 0) {
        sqlite3VdbeAddOp3(p,0x82,iVar5,0,0);
      }
      sqlite3VdbeAddOp3(p,0x84,iVar5,iVar11,0);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 0x10;
      }
      if (iVar11 != 0) {
        bVar3 = pParse->nTempReg;
        if ((ulong)bVar3 < 8) {
          pParse->nTempReg = bVar3 + 1;
          pParse->aTempReg[bVar3] = iVar11;
        }
      }
      sqlite3VdbeAddOp3(p,3,iVar4,local_68,0);
      if (p->db->mallocFailed == '\0') {
        iVar11 = p->nOp + -1;
        if (-1 < iVar12) {
          iVar11 = iVar12;
        }
        pOVar9 = p->aOp + iVar11;
      }
      else {
        pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar9->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
      sqlite3VdbeAddOp3(p,0x75,iVar5,0,0);
      sqlite3VdbeAddOp3(p,0x75,iVar4,0,0);
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || db->mallocFailed || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);
  sqlite3MultiWrite(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeGoto(v, 1);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeVerifyAbortable(v, OE_Abort);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
    sqlite3VdbeJumpHere(v, j2);
  }else{
    /* Most CREATE INDEX and REINDEX statements that are not UNIQUE can not
    ** abort. The exception is if one of the indexed expressions contains a
    ** user function that throws an exception when it is evaluated. But the
    ** overhead of adding a statement journal to a CREATE INDEX statement is
    ** very small (since most of the pages written do not contain content that
    ** needs to be restored if the statement aborts), so we call 
    ** sqlite3MayAbort() for all CREATE INDEX statements.  */
    sqlite3MayAbort(pParse);
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  if( !pIndex->bAscKeyBug ){
    /* This OP_SeekEnd opcode makes index insert for a REINDEX go much
    ** faster by avoiding unnecessary seeks.  But the optimization does
    ** not work for UNIQUE constraint indexes on WITHOUT ROWID tables
    ** with DESC primary keys, since those indexes have there keys in
    ** a different order from the main table.
    ** See ticket: https://www.sqlite.org/src/info/bba7b69f9849b5bf
    */
    sqlite3VdbeAddOp1(v, OP_SeekEnd, iIdx);
  }
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}